

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFGdbIndex.cpp
# Opt level: O2

bool __thiscall llvm::DWARFGdbIndex::parseImpl(DWARFGdbIndex *this,DataExtractor Data)

{
  SmallVectorImpl<llvm::DWARFGdbIndex::CompUnitEntry> *this_00;
  SmallVectorImpl<std::pair<unsigned_int,llvm::SmallVector<unsigned_int,0u>>> *this_01;
  uint32_t uVar1;
  uint32_t uVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  reference pTVar6;
  SmallVectorImpl<llvm::DWARFGdbIndex::SymTableEntry> *pSVar7;
  reference ppVar8;
  uint32_t I;
  int iVar9;
  ulong uVar10;
  size_type idx;
  bool bVar11;
  StringRef SVar12;
  int local_6c;
  AddressEntry local_68;
  SmallVectorTemplateCommon<llvm::DWARFGdbIndex::TypeUnitEntry,_void> *local_50;
  SmallVectorImpl<llvm::DWARFGdbIndex::AddressEntry> *local_48;
  uint64_t local_40;
  uint64_t Offset;
  
  local_40 = 0;
  bVar11 = false;
  uVar1 = DataExtractor::getU32(&Data,&local_40,(Error *)0x0);
  this->Version = uVar1;
  if (uVar1 == 7) {
    bVar11 = false;
    Offset = (uint64_t)this;
    uVar1 = DataExtractor::getU32(&Data,&local_40,(Error *)0x0);
    *(uint32_t *)(Offset + 4) = uVar1;
    uVar1 = DataExtractor::getU32(&Data,&local_40,(Error *)0x0);
    *(uint32_t *)(Offset + 8) = uVar1;
    uVar1 = DataExtractor::getU32(&Data,&local_40,(Error *)0x0);
    *(uint32_t *)(Offset + 0xc) = uVar1;
    uVar1 = DataExtractor::getU32(&Data,&local_40,(Error *)0x0);
    *(uint32_t *)(Offset + 0x10) = uVar1;
    uVar1 = DataExtractor::getU32(&Data,&local_40,(Error *)0x0);
    *(uint32_t *)(Offset + 0x14) = uVar1;
    if (local_40 == *(uint *)(Offset + 4)) {
      uVar10 = (ulong)(*(int *)(Offset + 8) - *(uint *)(Offset + 4) >> 4);
      this_00 = (SmallVectorImpl<llvm::DWARFGdbIndex::CompUnitEntry> *)(Offset + 0x18);
      SmallVectorImpl<llvm::DWARFGdbIndex::CompUnitEntry>::reserve(this_00,uVar10);
      while (iVar9 = (int)uVar10, uVar10 = (ulong)(iVar9 - 1), iVar9 != 0) {
        uVar3 = DataExtractor::getU64(&Data,&local_40,(Error *)0x0);
        local_68.HighAddress = DataExtractor::getU64(&Data,&local_40,(Error *)0x0);
        local_68.LowAddress = uVar3;
        SmallVectorTemplateBase<llvm::DWARFGdbIndex::CompUnitEntry,_true>::push_back
                  ((SmallVectorTemplateBase<llvm::DWARFGdbIndex::CompUnitEntry,_true> *)this_00,
                   (CompUnitEntry *)&local_68);
      }
      local_48 = (SmallVectorImpl<llvm::DWARFGdbIndex::AddressEntry> *)
                 ((ulong)(uint)(*(int *)(Offset + 0xc) - *(int *)(Offset + 8)) / 0x18);
      local_50 = (SmallVectorTemplateCommon<llvm::DWARFGdbIndex::TypeUnitEntry,_void> *)
                 (Offset + 0x28);
      SmallVectorImpl<llvm::DWARFGdbIndex::TypeUnitEntry>::resize
                ((SmallVectorImpl<llvm::DWARFGdbIndex::TypeUnitEntry> *)local_50,(size_type)local_48
                );
      for (idx = 0; local_48 != (SmallVectorImpl<llvm::DWARFGdbIndex::AddressEntry> *)idx;
          idx = idx + 1) {
        uVar3 = DataExtractor::getU64(&Data,&local_40,(Error *)0x0);
        uVar4 = DataExtractor::getU64(&Data,&local_40,(Error *)0x0);
        uVar5 = DataExtractor::getU64(&Data,&local_40,(Error *)0x0);
        pTVar6 = SmallVectorTemplateCommon<llvm::DWARFGdbIndex::TypeUnitEntry,_void>::operator[]
                           (local_50,idx);
        pTVar6->Offset = uVar3;
        pTVar6->TypeOffset = uVar4;
        pTVar6->TypeSignature = uVar5;
      }
      uVar10 = (ulong)(uint)(*(int *)(Offset + 0x10) - *(int *)(Offset + 0xc)) / 0x14;
      local_48 = (SmallVectorImpl<llvm::DWARFGdbIndex::AddressEntry> *)(Offset + 0x38);
      SmallVectorImpl<llvm::DWARFGdbIndex::AddressEntry>::reserve(local_48,uVar10);
      while (iVar9 = (int)uVar10, uVar10 = (ulong)(iVar9 - 1), iVar9 != 0) {
        uVar3 = DataExtractor::getU64(&Data,&local_40,(Error *)0x0);
        uVar4 = DataExtractor::getU64(&Data,&local_40,(Error *)0x0);
        local_68.CuIndex = DataExtractor::getU32(&Data,&local_40,(Error *)0x0);
        local_68.LowAddress = uVar3;
        local_68.HighAddress = uVar4;
        SmallVectorTemplateBase<llvm::DWARFGdbIndex::AddressEntry,_true>::push_back
                  (&local_48->super_SmallVectorTemplateBase<llvm::DWARFGdbIndex::AddressEntry,_true>
                   ,&local_68);
      }
      uVar10 = (ulong)((uint)(*(int *)(Offset + 0x14) - *(int *)(Offset + 0x10)) >> 3);
      local_50 = (SmallVectorTemplateCommon<llvm::DWARFGdbIndex::TypeUnitEntry,_void> *)
                 (Offset + 0x48);
      SmallVectorImpl<llvm::DWARFGdbIndex::SymTableEntry>::reserve
                ((SmallVectorImpl<llvm::DWARFGdbIndex::SymTableEntry> *)local_50,uVar10);
      local_48 = (SmallVectorImpl<llvm::DWARFGdbIndex::AddressEntry> *)0x0;
      while (iVar9 = (int)uVar10, uVar10 = (ulong)(iVar9 - 1), iVar9 != 0) {
        uVar1 = DataExtractor::getU32(&Data,&local_40,(Error *)0x0);
        uVar2 = DataExtractor::getU32(&Data,&local_40,(Error *)0x0);
        local_68.LowAddress = CONCAT44(uVar2,uVar1);
        SmallVectorTemplateBase<llvm::DWARFGdbIndex::SymTableEntry,_true>::push_back
                  ((SmallVectorTemplateBase<llvm::DWARFGdbIndex::SymTableEntry,_true> *)local_50,
                   (SymTableEntry *)&local_68);
        local_48 = (SmallVectorImpl<llvm::DWARFGdbIndex::AddressEntry> *)
                   (ulong)((int)local_48 + (uint)(uVar2 != 0 || uVar1 != 0));
      }
      this_01 = (SmallVectorImpl<std::pair<unsigned_int,llvm::SmallVector<unsigned_int,0u>>> *)
                (Offset + 0x58);
      pSVar7 = (SmallVectorImpl<llvm::DWARFGdbIndex::SymTableEntry> *)0x0;
      while ((int)pSVar7 != (int)local_48) {
        local_6c = 0;
        local_68.LowAddress = (uint64_t)&local_68.CuIndex;
        local_68.HighAddress = 0;
        local_50 = (SmallVectorTemplateCommon<llvm::DWARFGdbIndex::TypeUnitEntry,_void> *)pSVar7;
        SmallVectorImpl<std::pair<unsigned_int,llvm::SmallVector<unsigned_int,0u>>>::
        emplace_back<int,llvm::SmallVector<unsigned_int,0u>>
                  (this_01,&local_6c,(SmallVector<unsigned_int,_0U> *)&local_68);
        SmallVectorImpl<unsigned_int>::~SmallVectorImpl((SmallVectorImpl<unsigned_int> *)&local_68);
        ppVar8 = SmallVectorTemplateCommon<std::pair<unsigned_int,_llvm::SmallVector<unsigned_int,_0U>_>,_void>
                 ::back((SmallVectorTemplateCommon<std::pair<unsigned_int,_llvm::SmallVector<unsigned_int,_0U>_>,_void>
                         *)this_01);
        ppVar8->first = (int)local_40 - *(int *)(Offset + 0x14);
        uVar1 = DataExtractor::getU32(&Data,&local_40,(Error *)0x0);
        while (bVar11 = uVar1 != 0, uVar1 = uVar1 - 1, bVar11) {
          uVar2 = DataExtractor::getU32(&Data,&local_40,(Error *)0x0);
          local_68.LowAddress = CONCAT44(local_68.LowAddress._4_4_,uVar2);
          SmallVectorTemplateBase<unsigned_int,_true>::push_back
                    ((SmallVectorTemplateBase<unsigned_int,_true> *)&ppVar8->second,
                     (uint *)&local_68);
        }
        pSVar7 = (SmallVectorImpl<llvm::DWARFGdbIndex::SymTableEntry> *)(ulong)((int)local_50 + 1);
      }
      local_68.LowAddress = (uint64_t)Data.Data.Data;
      local_68.HighAddress = Data.Data.Length;
      SVar12 = StringRef::drop_front((StringRef *)&local_68,local_40);
      *(StringRef *)(Offset + 0x68) = SVar12;
      *(int *)(Offset + 0x78) = (int)local_40;
      bVar11 = true;
    }
  }
  return bVar11;
}

Assistant:

bool DWARFGdbIndex::parseImpl(DataExtractor Data) {
  uint64_t Offset = 0;

  // Only version 7 is supported at this moment.
  Version = Data.getU32(&Offset);
  if (Version != 7)
    return false;

  CuListOffset = Data.getU32(&Offset);
  TuListOffset = Data.getU32(&Offset);
  AddressAreaOffset = Data.getU32(&Offset);
  SymbolTableOffset = Data.getU32(&Offset);
  ConstantPoolOffset = Data.getU32(&Offset);

  if (Offset != CuListOffset)
    return false;

  uint32_t CuListSize = (TuListOffset - CuListOffset) / 16;
  CuList.reserve(CuListSize);
  for (uint32_t i = 0; i < CuListSize; ++i) {
    uint64_t CuOffset = Data.getU64(&Offset);
    uint64_t CuLength = Data.getU64(&Offset);
    CuList.push_back({CuOffset, CuLength});
  }

  // CU Types are no longer needed as DWARF skeleton type units never made it
  // into the standard.
  uint32_t TuListSize = (AddressAreaOffset - TuListOffset) / 24;
  TuList.resize(TuListSize);
  for (uint32_t I = 0; I < TuListSize; ++I) {
    uint64_t CuOffset = Data.getU64(&Offset);
    uint64_t TypeOffset = Data.getU64(&Offset);
    uint64_t Signature = Data.getU64(&Offset);
    TuList[I] = {CuOffset, TypeOffset, Signature};
  }

  uint32_t AddressAreaSize = (SymbolTableOffset - AddressAreaOffset) / 20;
  AddressArea.reserve(AddressAreaSize);
  for (uint32_t i = 0; i < AddressAreaSize; ++i) {
    uint64_t LowAddress = Data.getU64(&Offset);
    uint64_t HighAddress = Data.getU64(&Offset);
    uint32_t CuIndex = Data.getU32(&Offset);
    AddressArea.push_back({LowAddress, HighAddress, CuIndex});
  }

  // The symbol table. This is an open addressed hash table. The size of the
  // hash table is always a power of 2.
  // Each slot in the hash table consists of a pair of offset_type values. The
  // first value is the offset of the symbol's name in the constant pool. The
  // second value is the offset of the CU vector in the constant pool.
  // If both values are 0, then this slot in the hash table is empty. This is ok
  // because while 0 is a valid constant pool index, it cannot be a valid index
  // for both a string and a CU vector.
  uint32_t SymTableSize = (ConstantPoolOffset - SymbolTableOffset) / 8;
  SymbolTable.reserve(SymTableSize);
  uint32_t CuVectorsTotal = 0;
  for (uint32_t i = 0; i < SymTableSize; ++i) {
    uint32_t NameOffset = Data.getU32(&Offset);
    uint32_t CuVecOffset = Data.getU32(&Offset);
    SymbolTable.push_back({NameOffset, CuVecOffset});
    if (NameOffset || CuVecOffset)
      ++CuVectorsTotal;
  }

  // The constant pool. CU vectors are stored first, followed by strings.
  // The first value is the number of CU indices in the vector. Each subsequent
  // value is the index and symbol attributes of a CU in the CU list.
  for (uint32_t i = 0; i < CuVectorsTotal; ++i) {
    ConstantPoolVectors.emplace_back(0, SmallVector<uint32_t, 0>());
    auto &Vec = ConstantPoolVectors.back();
    Vec.first = Offset - ConstantPoolOffset;

    uint32_t Num = Data.getU32(&Offset);
    for (uint32_t j = 0; j < Num; ++j)
      Vec.second.push_back(Data.getU32(&Offset));
  }

  ConstantPoolStrings = Data.getData().drop_front(Offset);
  StringPoolOffset = Offset;
  return true;
}